

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenConstSetValueF32(BinaryenExpressionRef expr,float value)

{
  bool bVar1;
  Literal local_38;
  BinaryenExpressionRef local_20;
  Expression *expression;
  BinaryenExpressionRef pEStack_10;
  float value_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression._4_4_ = value;
  pEStack_10 = expr;
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xaec,"void BinaryenConstSetValueF32(BinaryenExpressionRef, float)");
  }
  wasm::Literal::Literal(&local_38,expression._4_4_);
  wasm::Literal::operator=((Literal *)(local_20 + 1),&local_38);
  wasm::Literal::~Literal(&local_38);
  return;
}

Assistant:

void BinaryenConstSetValueF32(BinaryenExpressionRef expr, float value) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  static_cast<Const*>(expression)->value = Literal(value);
}